

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

bool __thiscall ftxui::MenuBase::OnEvent(MenuBase *this,Event *event)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  MenuOption *pMVar6;
  bool local_142;
  bool local_131;
  int local_10c [2];
  byte local_101;
  Event local_100;
  byte local_b9;
  Event local_b8;
  int local_78;
  int old_selected;
  Event local_68;
  unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
  local_28;
  Event *local_20;
  Event *event_local;
  MenuBase *this_local;
  
  local_20 = event;
  event_local = (Event *)this;
  ComponentBase::CaptureMouse((ComponentBase *)&local_28,(Event *)this);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
  std::
  unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>::
  ~unique_ptr(&local_28);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    bVar2 = Event::is_mouse(event);
    if (bVar2) {
      Event::Event(&local_68,event);
      this_local._7_1_ = OnMouseEvent(this,&local_68);
      Event::~Event(&local_68);
    }
    else {
      bVar2 = ComponentBase::Focused(&this->super_ComponentBase);
      if (bVar2) {
        local_78 = *this->selected_;
        bVar2 = Event::operator==(event,(Event *)Event::ArrowUp);
        local_b9 = 0;
        local_131 = true;
        if (!bVar2) {
          Event::Character(&local_b8,'k');
          local_b9 = 1;
          local_131 = Event::operator==(event,&local_b8);
        }
        if ((local_b9 & 1) != 0) {
          Event::~Event(&local_b8);
        }
        if (local_131 != false) {
          *this->selected_ = *this->selected_ + -1;
        }
        bVar2 = Event::operator==(event,(Event *)Event::ArrowDown);
        local_101 = 0;
        local_142 = true;
        if (!bVar2) {
          Event::Character(&local_100,'j');
          local_101 = 1;
          local_142 = Event::operator==(event,&local_100);
        }
        if ((local_101 & 1) != 0) {
          Event::~Event(&local_100);
        }
        if (local_142 != false) {
          *this->selected_ = *this->selected_ + 1;
        }
        bVar2 = Event::operator==(event,(Event *)Event::Tab);
        if ((bVar2) && (sVar4 = ConstStringListRef::size(&this->entries_), sVar4 != 0)) {
          iVar1 = *this->selected_;
          sVar4 = ConstStringListRef::size(&this->entries_);
          *this->selected_ = (int)((ulong)(long)(iVar1 + 1) % sVar4);
        }
        bVar2 = Event::operator==(event,(Event *)Event::TabReverse);
        if ((bVar2) && (sVar4 = ConstStringListRef::size(&this->entries_), sVar4 != 0)) {
          iVar1 = *this->selected_;
          sVar4 = ConstStringListRef::size(&this->entries_);
          sVar3 = ConstStringListRef::size(&this->entries_);
          *this->selected_ = (int)((((long)iVar1 + sVar4) - 1) % sVar3);
        }
        local_10c[1] = 0;
        sVar4 = ConstStringListRef::size(&this->entries_);
        local_10c[0] = (int)sVar4 + -1;
        piVar5 = std::min<int>(local_10c,this->selected_);
        piVar5 = std::max<int>(local_10c + 1,piVar5);
        *this->selected_ = *piVar5;
        if (*this->selected_ == local_78) {
          bVar2 = Event::operator==(event,(Event *)Event::Return);
          if (bVar2) {
            pMVar6 = Ref<ftxui::MenuOption>::operator->(&this->option_);
            std::function<void_()>::operator()(&pMVar6->on_enter);
            this_local._7_1_ = 1;
          }
          else {
            this_local._7_1_ = 0;
          }
        }
        else {
          iVar1 = *this->selected_;
          piVar5 = focused_entry(this);
          *piVar5 = iVar1;
          pMVar6 = Ref<ftxui::MenuOption>::operator->(&this->option_);
          std::function<void_()>::operator()(&pMVar6->on_change);
          this_local._7_1_ = 1;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OnEvent(Event event) {
    if (!CaptureMouse(event))
      return false;
    if (event.is_mouse())
      return OnMouseEvent(event);

    if (!Focused())
      return false;

    int old_selected = *selected_;
    if (event == Event::ArrowUp || event == Event::Character('k'))
      (*selected_)--;
    if (event == Event::ArrowDown || event == Event::Character('j'))
      (*selected_)++;
    if (event == Event::Tab && entries_.size())
      *selected_ = (*selected_ + 1) % entries_.size();
    if (event == Event::TabReverse && entries_.size())
      *selected_ = (*selected_ + entries_.size() - 1) % entries_.size();

    *selected_ = std::max(0, std::min(int(entries_.size()) - 1, *selected_));

    if (*selected_ != old_selected) {
      focused_entry() = *selected_;
      option_->on_change();
      return true;
    }

    if (event == Event::Return) {
      option_->on_enter();
      return true;
    }

    return false;
  }